

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSVIWriterHandlers.cpp
# Opt level: O1

void __thiscall
PSVIWriterHandlers::processMemberTypeDefinitions
          (PSVIWriterHandlers *this,XSSimpleTypeDefinitionList *memberTypes)

{
  XSSimpleTypeDefinition *type;
  uint uVar1;
  XMLSize_t getAt;
  
  if (memberTypes != (XSSimpleTypeDefinitionList *)0x0) {
    writeOpen(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgMemberTypeDefinitions);
    incIndent(this);
    if (*(long *)(memberTypes + 0x10) != 0) {
      uVar1 = 1;
      getAt = 0;
      do {
        type = xercesc_4_0::BaseRefVectorOf<xercesc_4_0::XSSimpleTypeDefinition>::elementAt
                         ((BaseRefVectorOf<xercesc_4_0::XSSimpleTypeDefinition> *)memberTypes,getAt)
        ;
        processTypeDefinitionOrRef
                  (this,(XMLCh *)&xercesc_4_0::PSVIUni::fgMemberTypeDefinition,
                   (XSTypeDefinition *)type);
        getAt = (XMLSize_t)uVar1;
        uVar1 = uVar1 + 1;
      } while (getAt < *(ulong *)(memberTypes + 0x10));
    }
    sendUnindentedElement(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgMemberTypeDefinitions);
    return;
  }
  sendElementEmpty(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgMemberTypeDefinitions);
  return;
}

Assistant:

void PSVIWriterHandlers::processMemberTypeDefinitions(XSSimpleTypeDefinitionList* memberTypes) {
	if (memberTypes == NULL) {
		sendElementEmpty(PSVIUni::fgMemberTypeDefinitions);
	} else {
		sendIndentedElement(PSVIUni::fgMemberTypeDefinitions);
		for (unsigned int i = 0; i < memberTypes->size(); i++) {
			processTypeDefinitionOrRef(PSVIUni::fgMemberTypeDefinition, (XSTypeDefinition*)memberTypes->elementAt(i));
		}
		sendUnindentedElement(PSVIUni::fgMemberTypeDefinitions);
	}
}